

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O3

Bool Ppmd7_Alloc(CPpmd7 *p,UInt32 size)

{
  Byte *pBVar1;
  Bool BVar2;
  
  if ((p->Base == (Byte *)0x0) || (BVar2 = 1, p->Size != size)) {
    BVar2 = 0;
    if (0xb < size) {
      free(p->Base);
      p->Size = 0;
      p->AlignOffset = 4 - (size & 3);
      pBVar1 = (Byte *)malloc((ulong)((size & 0xfffffffc) + 0x10));
      p->Base = pBVar1;
      BVar2 = 0;
      if (pBVar1 != (Byte *)0x0) {
        p->Size = size;
        BVar2 = 1;
      }
    }
  }
  return BVar2;
}

Assistant:

static Bool Ppmd7_Alloc(CPpmd7 *p, UInt32 size)
{
  if (p->Base == 0 || p->Size != size)
  {
    /* RestartModel() below assumes that p->Size >= UNIT_SIZE
       (see the calculation of m->MinContext). */
    if (size < UNIT_SIZE) {
      return False;
    }
    Ppmd7_Free(p);
    p->AlignOffset =
      #ifdef PPMD_32BIT
        (4 - size) & 3;
      #else
        4 - (size & 3);
      #endif
    if ((p->Base = (Byte *)malloc(p->AlignOffset + size
        #ifndef PPMD_32BIT
        + UNIT_SIZE
        #endif
        )) == 0)
      return False;
    p->Size = size;
  }
  return True;
}